

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_subs_s_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  char cVar1;
  short sVar2;
  float32 fVar3;
  int iVar4;
  float64 fVar5;
  long lVar6;
  fpr_t *pfVar7;
  fpr_t *pfVar8;
  fpr_t *pfVar9;
  char cVar10;
  short sVar11;
  float32 fVar12;
  int iVar13;
  long lVar14;
  char cVar15;
  short sVar16;
  float32 fVar17;
  int iVar18;
  ulong uVar19;
  float64 fVar20;
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x12c6,
                  "void helper_msa_subs_s_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  pfVar7 = (env->active_fpu).fpr + wd;
  pfVar9 = (env->active_fpu).fpr + ws;
  pfVar8 = (env->active_fpu).fpr + wt;
  switch(df) {
  case 0:
    cVar1 = *(char *)pfVar9;
    uVar19 = (ulong)*(char *)pfVar8;
    cVar15 = cVar1 - *(char *)pfVar8;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)pfVar7 = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 1);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 1);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 1) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 3);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 3);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 3) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 5);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 5);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 5) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 7);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 7);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 7) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 9);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 9);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 9) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xb);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xb);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xb) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xd);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xd);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xd) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = cVar10;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xf);
    cVar15 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xf);
    uVar19 = (ulong)cVar15;
    cVar15 = cVar1 - cVar15;
    if ((long)uVar19 < 1) {
      cVar10 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar10 = cVar15;
      }
    }
    else {
      cVar10 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar10 = cVar15;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xf) = cVar10;
    return;
  case 1:
    sVar2 = *(short *)pfVar9;
    uVar19 = (ulong)*(short *)pfVar8;
    sVar11 = sVar2 - *(short *)pfVar8;
    if ((long)uVar19 < 1) {
      sVar16 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar16 = sVar11;
      }
    }
    else {
      sVar16 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar16 = sVar11;
      }
    }
    *(short *)pfVar7 = sVar16;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
    sVar11 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
    uVar19 = (ulong)sVar11;
    sVar11 = sVar2 - sVar11;
    if ((long)uVar19 < 1) {
      sVar16 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar16 = sVar11;
      }
    }
    else {
      sVar16 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar16 = sVar11;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = sVar16;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    sVar11 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    uVar19 = (ulong)sVar11;
    sVar11 = sVar2 - sVar11;
    if ((long)uVar19 < 1) {
      sVar16 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar16 = sVar11;
      }
    }
    else {
      sVar16 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar16 = sVar11;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = sVar16;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
    sVar11 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
    uVar19 = (ulong)sVar11;
    sVar11 = sVar2 - sVar11;
    if ((long)uVar19 < 1) {
      sVar16 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar16 = sVar11;
      }
    }
    else {
      sVar16 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar16 = sVar11;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = sVar16;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    sVar11 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    uVar19 = (ulong)sVar11;
    sVar11 = sVar2 - sVar11;
    if ((long)uVar19 < 1) {
      sVar16 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar16 = sVar11;
      }
    }
    else {
      sVar16 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar16 = sVar11;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = sVar16;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
    sVar11 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
    uVar19 = (ulong)sVar11;
    sVar11 = sVar2 - sVar11;
    if ((long)uVar19 < 1) {
      sVar16 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar16 = sVar11;
      }
    }
    else {
      sVar16 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar16 = sVar11;
      }
    }
    break;
  case 2:
    fVar3 = pfVar9->fs[0];
    uVar19 = (ulong)(int)pfVar8->fs[0];
    fVar12 = fVar3 - pfVar8->fs[0];
    if ((long)uVar19 < 1) {
      fVar17 = 0x7fffffff;
      if ((long)(int)fVar3 < (long)(uVar19 + 0x7fffffff)) {
        fVar17 = fVar12;
      }
    }
    else {
      fVar17 = 0x80000000;
      if ((long)(uVar19 | 0xffffffff80000000) < (long)(int)fVar3) {
        fVar17 = fVar12;
      }
    }
    pfVar7->fs[0] = fVar17;
    iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    iVar13 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    uVar19 = (ulong)iVar13;
    iVar13 = iVar4 - iVar13;
    if ((long)uVar19 < 1) {
      iVar18 = 0x7fffffff;
      if ((long)iVar4 < (long)(uVar19 + 0x7fffffff)) {
        iVar18 = iVar13;
      }
    }
    else {
      iVar18 = -0x80000000;
      if ((long)(uVar19 | 0xffffffff80000000) < (long)iVar4) {
        iVar18 = iVar13;
      }
    }
    *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = iVar18;
    iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    iVar13 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    uVar19 = (ulong)iVar13;
    iVar13 = iVar4 - iVar13;
    if ((long)uVar19 < 1) {
      iVar18 = 0x7fffffff;
      if ((long)iVar4 < (long)(uVar19 + 0x7fffffff)) {
        iVar18 = iVar13;
      }
    }
    else {
      iVar18 = -0x80000000;
      if ((long)(uVar19 | 0xffffffff80000000) < (long)iVar4) {
        iVar18 = iVar13;
      }
    }
    *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = iVar18;
    iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    iVar13 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    uVar19 = (ulong)iVar13;
    iVar13 = iVar4 - iVar13;
    if ((long)uVar19 < 1) {
      iVar18 = 0x7fffffff;
      if ((long)iVar4 < (long)(uVar19 + 0x7fffffff)) {
        iVar18 = iVar13;
      }
    }
    else {
      iVar18 = -0x80000000;
      if ((long)(uVar19 | 0xffffffff80000000) < (long)iVar4) {
        iVar18 = iVar13;
      }
    }
    *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = iVar18;
    return;
  case 3:
    uVar19 = pfVar9->fd;
    fVar5 = pfVar8->fd;
    if ((long)fVar5 < 1) {
      fVar20 = uVar19 - fVar5;
      if ((long)(fVar5 + 0x7fffffffffffffff) <= (long)uVar19) {
        fVar20 = 0x7fffffffffffffff;
      }
    }
    else {
      fVar20 = 0x8000000000000000;
      if (fVar5 + 0x8000000000000000 < uVar19) {
        fVar20 = uVar19 - fVar5;
      }
    }
    pfVar7->fd = fVar20;
    uVar19 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    lVar6 = *(long *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    if (lVar6 < 1) {
      lVar14 = 0x7fffffffffffffff;
      if ((long)uVar19 < lVar6 + 0x7fffffffffffffff) {
        lVar14 = uVar19 - lVar6;
      }
    }
    else {
      lVar14 = -0x8000000000000000;
      if (lVar6 + 0x8000000000000000U < uVar19) {
        lVar14 = uVar19 - lVar6;
      }
    }
    *(long *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = lVar14;
    return;
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = sVar16;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  sVar11 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  uVar19 = (ulong)sVar11;
  sVar11 = sVar2 - sVar11;
  if ((long)uVar19 < 1) {
    sVar16 = 0x7fff;
    if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
      sVar16 = sVar11;
    }
  }
  else {
    sVar16 = -0x8000;
    if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
      sVar16 = sVar11;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = sVar16;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  sVar11 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
  uVar19 = (ulong)sVar11;
  sVar11 = sVar2 - sVar11;
  if ((long)uVar19 < 1) {
    sVar16 = 0x7fff;
    if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
      sVar16 = sVar11;
    }
  }
  else {
    sVar16 = -0x8000;
    if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
      sVar16 = sVar11;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = sVar16;
  return;
}

Assistant:

MSA_BINOP_DF(subv)
MSA_BINOP_DF(subs_s)
MSA_BINOP_DF(subs_u)
MSA_BINOP_DF(subsus_u)
MSA_BINOP_DF(subsuu_s)
MSA_BINOP_DF(mulv)
MSA_BINOP_DF(dotp_s)
MSA_BINOP_DF(dotp_u)

MSA_BINOP_DF(mul_q)
MSA_BINOP_DF(mulr_q)
#undef MSA_BINOP_DF

void helper_msa_sld_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                       uint32_t ws, uint32_t rt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    msa_sld_df(df, pwd, pws, env->active_tc.gpr[rt]);
}